

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_stats.cpp
# Opt level: O0

void duckdb::ArrayStats::Verify
               (BaseStatistics *stats,Vector *vector,SelectionVector *sel,idx_t count)

{
  idx_t iVar1;
  idx_t idx_00;
  SelectionVector *this;
  TemplatedValidityMask<unsigned_long> *this_00;
  ulong in_RCX;
  SelectionVector *in_RDX;
  Vector *in_RSI;
  idx_t in_stack_00000028;
  SelectionVector *in_stack_00000030;
  Vector *in_stack_00000038;
  idx_t elem_idx;
  idx_t offset;
  idx_t index_1;
  idx_t idx_1;
  idx_t i_1;
  idx_t element_count;
  SelectionVector element_sel;
  idx_t index;
  idx_t idx;
  idx_t i;
  idx_t valid_count;
  UnifiedVectorFormat vdata;
  idx_t array_size;
  Vector *child_entry;
  BaseStatistics *child_stats;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffed8;
  UnifiedVectorFormat *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  SelectionVector *in_stack_fffffffffffffef0;
  ulong local_f8;
  BaseStatistics *in_stack_ffffffffffffff10;
  ulong local_d8;
  ulong local_a0;
  SelectionVector *local_80;
  UnifiedVectorFormat *in_stack_ffffffffffffff90;
  idx_t in_stack_ffffffffffffff98;
  Vector *in_stack_ffffffffffffffa0;
  
  GetChildStats(in_stack_ffffffffffffff10);
  ArrayVector::GetEntry((Vector *)0xb76dd9);
  Vector::GetType(in_RSI);
  iVar1 = ArrayType::GetSize((LogicalType *)
                             CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffee0);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  for (local_a0 = 0; local_a0 < in_RCX; local_a0 = local_a0 + 1) {
    idx_00 = SelectionVector::get_index(in_RDX,local_a0);
    in_stack_fffffffffffffef0 = (SelectionVector *)SelectionVector::get_index(local_80,idx_00);
    in_stack_fffffffffffffeef =
         TemplatedValidityMask<unsigned_long>::RowIsValid
                   (in_stack_fffffffffffffed8,
                    CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  }
  SelectionVector::SelectionVector
            (in_stack_fffffffffffffef0,CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8)
            );
  for (local_d8 = 0; local_d8 < in_RCX; local_d8 = local_d8 + 1) {
    this = (SelectionVector *)SelectionVector::get_index(in_RDX,local_d8);
    this_00 = (TemplatedValidityMask<unsigned_long> *)
              SelectionVector::get_index(local_80,(idx_t)this);
    in_stack_fffffffffffffed7 =
         TemplatedValidityMask<unsigned_long>::RowIsValid
                   (this_00,CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    if ((bool)in_stack_fffffffffffffed7) {
      for (local_f8 = 0; local_f8 < iVar1; local_f8 = local_f8 + 1) {
        SelectionVector::set_index
                  (this,(idx_t)this_00,CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0)
                  );
      }
    }
  }
  BaseStatistics::Verify
            ((BaseStatistics *)elem_idx,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  SelectionVector::~SelectionVector((SelectionVector *)0xb77093);
  UnifiedVectorFormat::~UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  return;
}

Assistant:

void ArrayStats::Verify(const BaseStatistics &stats, Vector &vector, const SelectionVector &sel, idx_t count) {
	auto &child_stats = ArrayStats::GetChildStats(stats);
	auto &child_entry = ArrayVector::GetEntry(vector);
	auto array_size = ArrayType::GetSize(vector.GetType());

	UnifiedVectorFormat vdata;
	vector.ToUnifiedFormat(count, vdata);

	// Basically,
	// 1. Count the number of valid arrays
	// 2. Create a selection vector with the size of the number of valid arrays * array_size
	// 3. Fill the selection vector with the offsets of all the elements in the child vector
	//      that exist in each valid array
	// 4. Use that selection vector to verify the child stats

	idx_t valid_count = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		if (vdata.validity.RowIsValid(index)) {
			valid_count++;
		}
	}

	SelectionVector element_sel(valid_count * array_size);
	idx_t element_count = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		auto offset = index * array_size;
		if (vdata.validity.RowIsValid(index)) {
			for (idx_t elem_idx = 0; elem_idx < array_size; elem_idx++) {
				element_sel.set_index(element_count++, offset + elem_idx);
			}
		}
	}

	child_stats.Verify(child_entry, element_sel, element_count);
}